

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::GeneratorBailIn::InsertRestoreSymbols
          (GeneratorBailIn *this,BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUses,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses,CapturedValues *capturedValues,
          BailInInsertionPoint *insertionPoint)

{
  ushort uVar1;
  Lifetime *lifetime;
  Instr *pIVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  RegSlot regSlot;
  uint32 offset;
  undefined4 *puVar6;
  Type *pTVar7;
  StackSym *this_00;
  StackSym *this_01;
  IndirOpnd *src;
  Instr *instr;
  SymOpnd *dst;
  RegOpnd *pRVar8;
  undefined1 local_58 [8];
  Iterator __iter;
  
  local_58 = (undefined1  [8])this->bailInSymbols;
  __iter.list = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                 *)local_58;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  __iter.current = (NodeBase *)this;
  do {
    if (__iter.list ==
        (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *)
        0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
LAB_005928e4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    __iter.list = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                   *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_58) {
      return;
    }
    pTVar7 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_58);
    this_00 = SymTable::FindStackSym(this->func->m_symTable,pTVar7->toBackendId);
    lifetime = *(Lifetime **)&(this_00->scratch).globOpt;
    if (lifetime == (Lifetime *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1461,"(lifetime)","lifetime");
      if (!bVar4) goto LAB_005928e4;
      *puVar6 = 0;
      this = (GeneratorBailIn *)__iter.current;
    }
    this_01 = SymTable::FindStackSym(this->func->m_symTable,pTVar7->fromByteCodeRegSlot);
    regSlot = StackSym::GetByteCodeRegSlot(this_01);
    if ((pTVar7->field_0x8 & 1) == 0) {
      pRVar8 = this->interpreterFrameRegOpnd;
      offset = GetOffsetFromInterpreterStackFrame(this,regSlot);
      src = IR::IndirOpnd::New(pRVar8,offset,this_01->m_type,this->func,false);
    }
    else {
      src = (IndirOpnd *)
            IR::AddrOpnd::New(pTVar7->constValue,AddrOpndKindDynamicVar,this->func,false,(Var)0x0);
    }
    uVar1 = *(ushort *)&lifetime->field_0x9c;
    bVar4 = StackSym::IsConst(this_00);
    if ((uVar1 & 1) == 0) {
      if (bVar4) {
        instr = InsertLoad(this->linearScan,insertionPoint->instrInsertRegSym,this_00,lifetime->reg)
        ;
      }
      else {
        pRVar8 = IR::RegOpnd::New(this_00,this_00->m_type,this->func);
        pRVar8->m_reg = lifetime->reg;
        instr = InsertMove(&pRVar8->super_Opnd,&src->super_Opnd,insertionPoint->instrInsertRegSym);
      }
      if (insertionPoint->instrInsertRegSym == insertionPoint->instrInsertStackSym) {
        insertionPoint->instrInsertStackSym = instr;
      }
      if (lifetime->reg == this->interpreterFrameRegOpnd->m_reg) {
        if (insertionPoint->instrInsertRegSym == insertionPoint->instrInsertStackSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x14a0,
                             "(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym)"
                             ,
                             "insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym"
                            );
          if (!bVar4) goto LAB_005928e4;
          *puVar6 = 0;
        }
        insertionPoint->instrInsertRegSym = instr;
        if (insertionPoint->raxRestoreInstr != (Instr *)0x0) {
          IR::Instr::FreeSrc1(insertionPoint->raxRestoreInstr);
          pIVar2 = insertionPoint->raxRestoreInstr;
          pRVar8 = this->interpreterFrameRegOpnd;
          if (pIVar2->m_src1 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_005928e4;
            *puVar6 = 0;
            this = (GeneratorBailIn *)__iter.current;
          }
          func = pIVar2->m_func;
          if ((pRVar8->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_005928e4;
            *puVar6 = 0;
            this = (GeneratorBailIn *)__iter.current;
          }
          bVar5 = (pRVar8->super_Opnd).field_0xb;
          if ((bVar5 & 2) != 0) {
            pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,func);
            bVar5 = (pRVar8->super_Opnd).field_0xb;
          }
          (pRVar8->super_Opnd).field_0xb = bVar5 | 2;
          pIVar2->m_src1 = &pRVar8->super_Opnd;
        }
        insertionPoint->raxRestoreInstr = instr;
      }
      RecordDef(this->linearScan,lifetime,instr,0);
    }
    else {
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1478,"(!dstSym->IsConst())",
                           "We don\'t need to restore constant symbol that has already been spilled"
                          );
        if (!bVar4) goto LAB_005928e4;
        *puVar6 = 0;
      }
      this_00->field_0x19 = this_00->field_0x19 | 0x10;
      dst = IR::SymOpnd::New(&this_00->super_Sym,this_00->m_type,this->func);
      InsertMove(&this->tempRegOpnd->super_Opnd,&src->super_Opnd,insertionPoint->instrInsertStackSym
                );
      InsertMove(&dst->super_Opnd,&this->tempRegOpnd->super_Opnd,insertionPoint->instrInsertStackSym
                );
    }
  } while( true );
}

Assistant:

void LinearScan::GeneratorBailIn::InsertRestoreSymbols(
    const BVSparse<JitArenaAllocator>& byteCodeUpwardExposedUses,
    const BVSparse<JitArenaAllocator>& upwardExposedUses,
    const CapturedValues& capturedValues,
    BailInInsertionPoint& insertionPoint
)
{
    FOREACH_SLISTBASE_ENTRY(BailInSymbol, bailInSymbol, this->bailInSymbols)
    {
        StackSym* dstSym = this->func->m_symTable->FindStackSym(bailInSymbol.toBackendId);
        Lifetime* lifetime = dstSym->scratch.linearScan.lifetime;
        Assert(lifetime);

        StackSym* copyPropStackSym = this->func->m_symTable->FindStackSym(bailInSymbol.fromByteCodeRegSlot);
        Js::RegSlot regSlot = copyPropStackSym->GetByteCodeRegSlot();
        IR::Opnd* srcOpnd;
        
        if (bailInSymbol.restoreConstDirectly)
        {
            srcOpnd = IR::AddrOpnd::New(bailInSymbol.constValue, IR::AddrOpndKind::AddrOpndKindDynamicVar, this->func);
        }
        else
        {
            srcOpnd = IR::IndirOpnd::New(
                this->interpreterFrameRegOpnd,
                this->GetOffsetFromInterpreterStackFrame(regSlot),
                copyPropStackSym->GetType(),
                this->func
            );
        }

        if (lifetime->isSpilled)
        {
#if DBG
            AssertMsg(!dstSym->IsConst(), "We don't need to restore constant symbol that has already been spilled");
            // Supress assert in DbPostCheckLower
            dstSym->m_allocated = true;
#endif
            // Stack restores require an extra register since we can't move an indir directly to an indir on amd64
            IR::SymOpnd* dstOpnd = IR::SymOpnd::New(dstSym, dstSym->GetType(), this->func);
            LinearScan::InsertMove(this->tempRegOpnd, srcOpnd, insertionPoint.instrInsertStackSym);
            LinearScan::InsertMove(dstOpnd, this->tempRegOpnd, insertionPoint.instrInsertStackSym);
        }
        else
        {
            // Register restores must come after stack restores so that we have RAX and RCX free to
            // use for stack restores and further RAX must be restored last since it holds the
            // pointer to the InterpreterStackFrame from which we are restoring values.
            // We must also track these restores using RecordDef in case the symbols are spilled.

            IR::Instr* instr;

            if (dstSym->IsConst())
            {
                instr = this->linearScan->InsertLoad(insertionPoint.instrInsertRegSym, dstSym, lifetime->reg);
            }
            else
            {
                IR::RegOpnd* dstRegOpnd = IR::RegOpnd::New(dstSym, dstSym->GetType(), this->func);
                dstRegOpnd->SetReg(lifetime->reg);
                instr = LinearScan::InsertMove(dstRegOpnd, srcOpnd, insertionPoint.instrInsertRegSym);
            }

            if (insertionPoint.instrInsertRegSym == insertionPoint.instrInsertStackSym)
            {
                // This is the first register sym, make sure we don't insert stack stores
                // after this instruction so we can ensure rax and rcx remain free to use
                // for restoring spilled stack syms.
                insertionPoint.instrInsertStackSym = instr;
            }

            if (lifetime->reg == interpreterFrameRegOpnd->GetReg())
            {
                // Ensure rax is restored last
                Assert(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym);

                insertionPoint.instrInsertRegSym = instr;

                if (insertionPoint.raxRestoreInstr != nullptr)
                {
                    // rax was mapped to multiple bytecode registers. Obviously only the first
                    // restore we do will work so change all following stores to `mov rax, rax`.
                    // We still need to keep them around for RecordDef in case the corresponding
                    // dst sym is spilled later on.
                    insertionPoint.raxRestoreInstr->FreeSrc1();
                    insertionPoint.raxRestoreInstr->SetSrc1(this->interpreterFrameRegOpnd);
                }

                insertionPoint.raxRestoreInstr = instr;
            }

            this->linearScan->RecordDef(lifetime, instr, 0);
        }
    }
    NEXT_SLISTBASE_ENTRY;
}